

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

void prvTidyFreeAttrPriorityList(TidyDocImpl *doc)

{
  tmbstr ptVar1;
  ulong uVar2;
  tmbstr *pptVar3;
  
  pptVar3 = (doc->attribs).priorityAttribs.list;
  if (pptVar3 != (tmbstr *)0x0) {
    ptVar1 = *pptVar3;
    if (ptVar1 != (tmbstr)0x0) {
      uVar2 = 1;
      do {
        (*doc->allocator->vtbl->free)(doc->allocator,ptVar1);
        pptVar3 = (doc->attribs).priorityAttribs.list;
        ptVar1 = pptVar3[uVar2];
        uVar2 = (ulong)((int)uVar2 + 1);
      } while (ptVar1 != (tmbstr)0x0);
    }
    (*doc->allocator->vtbl->free)(doc->allocator,pptVar3);
    return;
  }
  return;
}

Assistant:

void TY_(FreeAttrPriorityList)( TidyDocImpl* doc )
{
    PriorityAttribs *priorities = &(doc->attribs.priorityAttribs);

    if ( priorities->list )
    {
        uint i = 0;
        while ( priorities->list[i] != NULL )
        {
            TidyFree( doc->allocator, priorities->list[i] );
            i++;
        }

        TidyFree( doc->allocator, priorities->list );
    }
}